

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expressionbuilder.h
# Opt level: O1

void __thiscall
snowhouse::
ExpressionBuilder<snowhouse::ConstraintList<snowhouse::ConstraintAdapter<snowhouse::EqualsConstraint<bool>_>,_snowhouse::Nil>_>
::Evaluate<bool>(ExpressionBuilder<snowhouse::ConstraintList<snowhouse::ConstraintAdapter<snowhouse::EqualsConstraint<bool>_>,_snowhouse::Nil>_>
                 *this,ResultStack *result,OperatorStack *operators,bool *actual)

{
  _Elt_pointer pbVar1;
  bool local_1;
  
  pbVar1 = (result->c).super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data
           ._M_finish._M_cur;
  if (pbVar1 == (result->c).super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<bool,_std::allocator<bool>_>::_M_push_back_aux<bool>(&result->c,&local_1);
  }
  else {
    *pbVar1 = (this->m_constraint_list).m_head.m_constraint.m_expected == *actual;
    (result->c).super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
    _M_finish._M_cur = pbVar1 + 1;
  }
  return;
}

Assistant:

void Evaluate(ResultStack& result, OperatorStack& operators, const ActualType& actual)
    {
      EvaluateConstraintList(m_constraint_list, result, operators, actual);
    }